

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_16781328,_true,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  byte bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  char cVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong *puVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar44 [16];
  undefined1 auVar47 [32];
  float fVar50;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar51;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  float fVar58;
  undefined1 auVar55 [32];
  undefined1 auVar60 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar73;
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  float fVar74;
  float fVar75;
  float fVar83;
  float fVar85;
  float fVar87;
  undefined1 auVar79 [16];
  float fVar82;
  float fVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar80 [32];
  float fVar86;
  undefined1 auVar81 [32];
  float fVar91;
  vfloat4 a0;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  float fVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar107;
  float fVar108;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar109;
  undefined1 auVar106 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_11d8 != 8) && (fVar125 = ray->tfar, 0.0 <= fVar125)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar59 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar44 = vrsqrtss_avx(auVar59,auVar59);
    fVar91 = auVar44._0_4_;
    fVar3 = (ray->dir).field_0.m128[0];
    fVar4 = (ray->dir).field_0.m128[1];
    local_1218[0] = fVar91 * 1.5 - auVar59._0_4_ * 0.5 * fVar91 * fVar91 * fVar91;
    fVar91 = (ray->dir).field_0.m128[2];
    auVar65 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
    auVar92._0_4_ = aVar7.x * auVar65._0_4_;
    auVar92._4_4_ = aVar7.y * auVar65._4_4_;
    auVar92._8_4_ = aVar7.z * auVar65._8_4_;
    auVar92._12_4_ = aVar7.field_3.w * auVar65._12_4_;
    auVar44 = vshufpd_avx(auVar92,auVar92,1);
    auVar59 = vmovshdup_avx(auVar92);
    auVar113._8_4_ = 0x80000000;
    auVar113._0_8_ = 0x8000000080000000;
    auVar113._12_4_ = 0x80000000;
    auVar95._12_4_ = 0;
    auVar95._0_12_ = ZEXT812(0);
    auVar95 = auVar95 << 0x20;
    auVar102 = vunpckhps_avx(auVar92,auVar95);
    auVar76 = vshufps_avx(auVar102,ZEXT416(auVar59._0_4_ ^ 0x80000000),0x41);
    auVar102._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
    auVar102._8_8_ = auVar44._8_8_ ^ auVar113._8_8_;
    auVar102 = vinsertps_avx(auVar102,auVar92,0x2a);
    auVar59 = vdpps_avx(auVar76,auVar76,0x7f);
    auVar44 = vdpps_avx(auVar102,auVar102,0x7f);
    auVar59 = vcmpps_avx(auVar44,auVar59,1);
    auVar59 = vshufps_avx(auVar59,auVar59,0);
    auVar59 = vblendvps_avx(auVar102,auVar76,auVar59);
    auVar44 = vdpps_avx(auVar59,auVar59,0x7f);
    auVar102 = vrsqrtss_avx(auVar44,auVar44);
    fVar97 = auVar102._0_4_;
    auVar44 = ZEXT416((uint)(fVar97 * 1.5 - auVar44._0_4_ * 0.5 * fVar97 * fVar97 * fVar97));
    auVar44 = vshufps_avx(auVar44,auVar44,0);
    auVar98._0_4_ = auVar59._0_4_ * auVar44._0_4_;
    auVar98._4_4_ = auVar59._4_4_ * auVar44._4_4_;
    auVar98._8_4_ = auVar59._8_4_ * auVar44._8_4_;
    auVar98._12_4_ = auVar59._12_4_ * auVar44._12_4_;
    auVar59 = vshufps_avx(auVar98,auVar98,0xc9);
    auVar44 = vshufps_avx(auVar92,auVar92,0xc9);
    auVar114._0_4_ = auVar44._0_4_ * auVar98._0_4_;
    auVar114._4_4_ = auVar44._4_4_ * auVar98._4_4_;
    auVar114._8_4_ = auVar44._8_4_ * auVar98._8_4_;
    auVar114._12_4_ = auVar44._12_4_ * auVar98._12_4_;
    auVar103._0_4_ = auVar59._0_4_ * auVar92._0_4_;
    auVar103._4_4_ = auVar59._4_4_ * auVar92._4_4_;
    auVar103._8_4_ = auVar59._8_4_ * auVar92._8_4_;
    auVar103._12_4_ = auVar59._12_4_ * auVar92._12_4_;
    auVar59 = vsubps_avx(auVar103,auVar114);
    auVar102 = vshufps_avx(auVar59,auVar59,0xc9);
    auVar59 = vdpps_avx(auVar102,auVar102,0x7f);
    auVar44 = vrsqrtss_avx(auVar59,auVar59);
    fVar97 = auVar44._0_4_;
    auVar59 = ZEXT416((uint)(fVar97 * 1.5 - fVar97 * fVar97 * fVar97 * auVar59._0_4_ * 0.5));
    auVar59 = vshufps_avx(auVar59,auVar59,0);
    auVar44._0_4_ = auVar102._0_4_ * auVar59._0_4_;
    auVar44._4_4_ = auVar102._4_4_ * auVar59._4_4_;
    auVar44._8_4_ = auVar102._8_4_ * auVar59._8_4_;
    auVar44._12_4_ = auVar102._12_4_ * auVar59._12_4_;
    auVar59._0_4_ = auVar65._0_4_ * auVar92._0_4_;
    auVar59._4_4_ = auVar65._4_4_ * auVar92._4_4_;
    auVar59._8_4_ = auVar65._8_4_ * auVar92._8_4_;
    auVar59._12_4_ = auVar65._12_4_ * auVar92._12_4_;
    auVar102 = vunpcklps_avx(auVar98,auVar59);
    auVar59 = vunpckhps_avx(auVar98,auVar59);
    auVar65 = vunpcklps_avx(auVar44,auVar95);
    auVar44 = vunpckhps_avx(auVar44,auVar95);
    local_11e8 = vunpcklps_avx(auVar59,auVar44);
    local_1208 = vunpcklps_avx(auVar102,auVar65);
    local_11f8 = vunpckhps_avx(auVar102,auVar65);
    puVar41 = local_11d0;
    auVar102 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar64 = ZEXT1664(auVar102);
    auVar65._8_4_ = 0x7fffffff;
    auVar65._0_8_ = 0x7fffffff7fffffff;
    auVar65._12_4_ = 0x7fffffff;
    auVar59 = vandps_avx((undefined1  [16])aVar7,auVar65);
    auVar76._8_4_ = 0x219392ef;
    auVar76._0_8_ = 0x219392ef219392ef;
    auVar76._12_4_ = 0x219392ef;
    auVar59 = vcmpps_avx(auVar59,auVar76,1);
    auVar77._8_4_ = 0x3f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._12_4_ = 0x3f800000;
    auVar44 = vdivps_avx(auVar77,(undefined1  [16])aVar7);
    auVar78._8_4_ = 0x5d5e0b6b;
    auVar78._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar78._12_4_ = 0x5d5e0b6b;
    auVar59 = vblendvps_avx(auVar44,auVar78,auVar59);
    auVar66._0_4_ = auVar59._0_4_ * 0.99999964;
    auVar66._4_4_ = auVar59._4_4_ * 0.99999964;
    auVar66._8_4_ = auVar59._8_4_ * 0.99999964;
    auVar66._12_4_ = auVar59._12_4_ * 0.99999964;
    fVar97 = (ray->org).field_0.m128[0];
    fVar5 = (ray->org).field_0.m128[1];
    auVar52._0_4_ = auVar59._0_4_ * 1.0000004;
    auVar52._4_4_ = auVar59._4_4_ * 1.0000004;
    auVar52._8_4_ = auVar59._8_4_ * 1.0000004;
    auVar52._12_4_ = auVar59._12_4_ * 1.0000004;
    fVar6 = (ray->org).field_0.m128[2];
    auVar65 = vshufps_avx(auVar66,auVar66,0);
    auVar59 = vmovshdup_avx(auVar66);
    auVar76 = vshufps_avx(auVar66,auVar66,0x55);
    auVar44 = vshufpd_avx(auVar66,auVar66,1);
    auVar95 = vshufps_avx(auVar66,auVar66,0xaa);
    auVar77 = vshufps_avx(auVar52,auVar52,0);
    auVar78 = vshufps_avx(auVar52,auVar52,0x55);
    auVar72 = ZEXT1664(auVar78);
    auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
    uVar43 = (ulong)(auVar66._0_4_ < 0.0) * 0x20;
    uVar42 = (ulong)(auVar59._0_4_ < 0.0) << 5 | 0x40;
    uVar40 = (ulong)(auVar44._0_4_ < 0.0) << 5 | 0x80;
    auVar59 = vshufps_avx(auVar102,auVar102,0);
    auVar122._16_16_ = auVar59;
    auVar122._0_16_ = auVar59;
    auVar44 = vshufps_avx(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),0);
    auVar123._16_16_ = auVar44;
    auVar123._0_16_ = auVar44;
LAB_002e2e2b:
    do {
      if (puVar41 == &local_11d8) {
        return;
      }
      uVar37 = puVar41[-1];
      puVar41 = puVar41 + -1;
      while ((uVar37 & 8) == 0) {
        fVar125 = (ray->dir).field_0.m128[3];
        uVar38 = (uint)uVar37 & 7;
        uVar36 = uVar37 & 0xfffffffffffffff0;
        fVar115 = auVar95._12_4_;
        fVar75 = auVar52._12_4_;
        if (uVar38 == 3) {
          fVar26 = *(float *)(uVar36 + 0xbc);
          auVar44 = vshufps_avx(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),0);
          fVar125 = 1.0 - fVar125;
          auVar102 = vshufps_avx(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),0);
          fVar74 = auVar44._0_4_;
          fVar82 = auVar44._4_4_;
          fVar84 = auVar44._8_4_;
          fVar86 = auVar44._12_4_;
          auVar44 = vshufps_avx(ZEXT416((uint)(fVar125 * 0.0)),ZEXT416((uint)(fVar125 * 0.0)),0);
          fVar51 = auVar44._0_4_;
          fVar56 = auVar44._4_4_;
          fVar57 = auVar44._8_4_;
          fVar58 = auVar44._12_4_;
          fVar116 = auVar102._0_4_;
          fVar118 = auVar102._4_4_;
          fVar119 = auVar102._8_4_;
          fVar120 = auVar102._12_4_;
          auVar117._0_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x260);
          auVar117._4_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x264);
          auVar117._8_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 0x268);
          auVar117._12_4_ = fVar120 + fVar86 * *(float *)(uVar36 + 0x26c);
          auVar117._16_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x270);
          auVar117._20_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x274);
          auVar117._24_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 0x278);
          auVar117._28_4_ = fVar120 + fVar86;
          auVar55._0_4_ =
               *(float *)(uVar36 + 0x40) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xa0) + *(float *)(uVar36 + 0x100) * fVar91;
          auVar55._4_4_ =
               *(float *)(uVar36 + 0x44) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xa4) + *(float *)(uVar36 + 0x104) * fVar91;
          auVar55._8_4_ =
               *(float *)(uVar36 + 0x48) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xa8) + *(float *)(uVar36 + 0x108) * fVar91;
          auVar55._12_4_ =
               *(float *)(uVar36 + 0x4c) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xac) + *(float *)(uVar36 + 0x10c) * fVar91;
          auVar55._16_4_ =
               *(float *)(uVar36 + 0x50) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xb0) + *(float *)(uVar36 + 0x110) * fVar91;
          auVar55._20_4_ =
               *(float *)(uVar36 + 0x54) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xb4) + *(float *)(uVar36 + 0x114) * fVar91;
          auVar55._24_4_ =
               *(float *)(uVar36 + 0x58) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xb8) + *(float *)(uVar36 + 0x118) * fVar91;
          auVar55._28_4_ = fVar75 + fVar75 + fVar58;
          auVar81._0_4_ =
               *(float *)(uVar36 + 0x60) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xc0) + fVar91 * *(float *)(uVar36 + 0x120);
          auVar81._4_4_ =
               *(float *)(uVar36 + 100) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xc4) + fVar91 * *(float *)(uVar36 + 0x124);
          auVar81._8_4_ =
               *(float *)(uVar36 + 0x68) * fVar3 +
               fVar4 * *(float *)(uVar36 + 200) + fVar91 * *(float *)(uVar36 + 0x128);
          auVar81._12_4_ =
               *(float *)(uVar36 + 0x6c) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xcc) + fVar91 * *(float *)(uVar36 + 300);
          auVar81._16_4_ =
               *(float *)(uVar36 + 0x70) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xd0) + fVar91 * *(float *)(uVar36 + 0x130);
          auVar81._20_4_ =
               *(float *)(uVar36 + 0x74) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xd4) + fVar91 * *(float *)(uVar36 + 0x134);
          auVar81._24_4_ =
               *(float *)(uVar36 + 0x78) * fVar3 +
               fVar4 * *(float *)(uVar36 + 0xd8) + fVar91 * *(float *)(uVar36 + 0x138);
          auVar81._28_4_ = *(float *)(uVar36 + 0xfc) + fVar75 + fVar86;
          auVar99._0_4_ =
               *(float *)(uVar36 + 0xe0) * fVar4 + fVar91 * *(float *)(uVar36 + 0x140) +
               *(float *)(uVar36 + 0x80) * fVar3;
          auVar99._4_4_ =
               *(float *)(uVar36 + 0xe4) * fVar4 + fVar91 * *(float *)(uVar36 + 0x144) +
               *(float *)(uVar36 + 0x84) * fVar3;
          auVar99._8_4_ =
               *(float *)(uVar36 + 0xe8) * fVar4 + fVar91 * *(float *)(uVar36 + 0x148) +
               *(float *)(uVar36 + 0x88) * fVar3;
          auVar99._12_4_ =
               *(float *)(uVar36 + 0xec) * fVar4 + fVar91 * *(float *)(uVar36 + 0x14c) +
               *(float *)(uVar36 + 0x8c) * fVar3;
          auVar99._16_4_ =
               *(float *)(uVar36 + 0xf0) * fVar4 + fVar91 * *(float *)(uVar36 + 0x150) +
               *(float *)(uVar36 + 0x90) * fVar3;
          auVar99._20_4_ =
               *(float *)(uVar36 + 0xf4) * fVar4 + fVar91 * *(float *)(uVar36 + 0x154) +
               *(float *)(uVar36 + 0x94) * fVar3;
          auVar99._24_4_ =
               *(float *)(uVar36 + 0xf8) * fVar4 + fVar91 * *(float *)(uVar36 + 0x158) +
               *(float *)(uVar36 + 0x98) * fVar3;
          auVar99._28_4_ = fVar75 + auVar59._12_4_ + 0.0;
          auVar47._8_4_ = 0x7fffffff;
          auVar47._0_8_ = 0x7fffffff7fffffff;
          auVar47._12_4_ = 0x7fffffff;
          auVar47._16_4_ = 0x7fffffff;
          auVar47._20_4_ = 0x7fffffff;
          auVar47._24_4_ = 0x7fffffff;
          auVar47._28_4_ = 0x7fffffff;
          auVar49 = vandps_avx(auVar55,auVar47);
          auVar104._8_4_ = 0x219392ef;
          auVar104._0_8_ = 0x219392ef219392ef;
          auVar104._12_4_ = 0x219392ef;
          auVar104._16_4_ = 0x219392ef;
          auVar104._20_4_ = 0x219392ef;
          auVar104._24_4_ = 0x219392ef;
          auVar104._28_4_ = 0x219392ef;
          auVar49 = vcmpps_avx(auVar49,auVar104,1);
          auVar63 = vblendvps_avx(auVar55,auVar104,auVar49);
          auVar49 = vandps_avx(auVar81,auVar47);
          auVar49 = vcmpps_avx(auVar49,auVar104,1);
          auVar10 = vblendvps_avx(auVar81,auVar104,auVar49);
          auVar49 = vandps_avx(auVar99,auVar47);
          auVar49 = vcmpps_avx(auVar49,auVar104,1);
          auVar9 = vrcpps_avx(auVar63);
          auVar49 = vblendvps_avx(auVar99,auVar104,auVar49);
          fVar125 = auVar9._0_4_;
          fVar126 = auVar9._4_4_;
          auVar11._4_4_ = auVar63._4_4_ * fVar126;
          auVar11._0_4_ = auVar63._0_4_ * fVar125;
          fVar127 = auVar9._8_4_;
          auVar11._8_4_ = auVar63._8_4_ * fVar127;
          fVar128 = auVar9._12_4_;
          auVar11._12_4_ = auVar63._12_4_ * fVar128;
          fVar129 = auVar9._16_4_;
          auVar11._16_4_ = auVar63._16_4_ * fVar129;
          fVar130 = auVar9._20_4_;
          auVar11._20_4_ = auVar63._20_4_ * fVar130;
          fVar131 = auVar9._24_4_;
          auVar11._24_4_ = auVar63._24_4_ * fVar131;
          auVar11._28_4_ = auVar63._28_4_;
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar105._16_4_ = 0x3f800000;
          auVar105._20_4_ = 0x3f800000;
          auVar105._24_4_ = 0x3f800000;
          auVar105._28_4_ = 0x3f800000;
          auVar11 = vsubps_avx(auVar105,auVar11);
          auVar63 = vrcpps_avx(auVar10);
          fVar125 = fVar125 * auVar11._0_4_ + fVar125;
          fVar126 = fVar126 * auVar11._4_4_ + fVar126;
          fVar127 = fVar127 * auVar11._8_4_ + fVar127;
          fVar128 = fVar128 * auVar11._12_4_ + fVar128;
          fVar129 = fVar129 * auVar11._16_4_ + fVar129;
          fVar130 = fVar130 * auVar11._20_4_ + fVar130;
          fVar131 = fVar131 * auVar11._24_4_ + fVar131;
          fVar75 = auVar63._0_4_;
          fVar83 = auVar63._4_4_;
          auVar19._4_4_ = auVar10._4_4_ * fVar83;
          auVar19._0_4_ = auVar10._0_4_ * fVar75;
          fVar85 = auVar63._8_4_;
          auVar19._8_4_ = auVar10._8_4_ * fVar85;
          fVar87 = auVar63._12_4_;
          auVar19._12_4_ = auVar10._12_4_ * fVar87;
          fVar88 = auVar63._16_4_;
          auVar19._16_4_ = auVar10._16_4_ * fVar88;
          fVar89 = auVar63._20_4_;
          auVar19._20_4_ = auVar10._20_4_ * fVar89;
          fVar90 = auVar63._24_4_;
          auVar19._24_4_ = auVar10._24_4_ * fVar90;
          auVar19._28_4_ = auVar9._28_4_;
          auVar9 = vsubps_avx(auVar105,auVar19);
          fVar75 = fVar75 + fVar75 * auVar9._0_4_;
          fVar83 = fVar83 + fVar83 * auVar9._4_4_;
          fVar85 = fVar85 + fVar85 * auVar9._8_4_;
          fVar87 = fVar87 + fVar87 * auVar9._12_4_;
          fVar88 = fVar88 + fVar88 * auVar9._16_4_;
          fVar89 = fVar89 + fVar89 * auVar9._20_4_;
          fVar90 = fVar90 + fVar90 * auVar9._24_4_;
          auVar10 = vrcpps_avx(auVar49);
          fVar101 = auVar10._0_4_;
          fVar107 = auVar10._4_4_;
          auVar20._4_4_ = auVar49._4_4_ * fVar107;
          auVar20._0_4_ = auVar49._0_4_ * fVar101;
          fVar108 = auVar10._8_4_;
          auVar20._8_4_ = auVar49._8_4_ * fVar108;
          fVar109 = auVar10._12_4_;
          auVar20._12_4_ = auVar49._12_4_ * fVar109;
          fVar110 = auVar10._16_4_;
          auVar20._16_4_ = auVar49._16_4_ * fVar110;
          fVar111 = auVar10._20_4_;
          auVar20._20_4_ = auVar49._20_4_ * fVar111;
          fVar112 = auVar10._24_4_;
          auVar20._24_4_ = auVar49._24_4_ * fVar112;
          auVar20._28_4_ = auVar63._28_4_;
          auVar49 = vsubps_avx(auVar105,auVar20);
          fVar101 = fVar101 + fVar101 * auVar49._0_4_;
          fVar107 = fVar107 + fVar107 * auVar49._4_4_;
          fVar108 = fVar108 + fVar108 * auVar49._8_4_;
          fVar109 = fVar109 + fVar109 * auVar49._12_4_;
          fVar110 = fVar110 + fVar110 * auVar49._16_4_;
          fVar111 = fVar111 + fVar111 * auVar49._20_4_;
          fVar112 = fVar112 + fVar112 * auVar49._24_4_;
          fVar50 = fVar26 + auVar10._28_4_ + *(float *)(uVar36 + 0x17c);
          fVar73 = fVar26 + *(float *)(uVar36 + 0x15c) + *(float *)(uVar36 + 0x1bc);
          auVar94._0_4_ =
               *(float *)(uVar36 + 0x40) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xa0) +
               *(float *)(uVar36 + 0x100) * fVar6 + *(float *)(uVar36 + 0x160);
          auVar94._4_4_ =
               *(float *)(uVar36 + 0x44) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xa4) +
               *(float *)(uVar36 + 0x104) * fVar6 + *(float *)(uVar36 + 0x164);
          auVar94._8_4_ =
               *(float *)(uVar36 + 0x48) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xa8) +
               *(float *)(uVar36 + 0x108) * fVar6 + *(float *)(uVar36 + 0x168);
          auVar94._12_4_ =
               *(float *)(uVar36 + 0x4c) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xac) +
               *(float *)(uVar36 + 0x10c) * fVar6 + *(float *)(uVar36 + 0x16c);
          auVar94._16_4_ =
               *(float *)(uVar36 + 0x50) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xb0) +
               *(float *)(uVar36 + 0x110) * fVar6 + *(float *)(uVar36 + 0x170);
          auVar94._20_4_ =
               *(float *)(uVar36 + 0x54) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xb4) +
               *(float *)(uVar36 + 0x114) * fVar6 + *(float *)(uVar36 + 0x174);
          auVar94._24_4_ =
               *(float *)(uVar36 + 0x58) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xb8) +
               *(float *)(uVar36 + 0x118) * fVar6 + *(float *)(uVar36 + 0x178);
          auVar94._28_4_ = fVar26 + fVar50;
          auVar96._0_4_ =
               *(float *)(uVar36 + 0x60) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xc0) +
               fVar6 * *(float *)(uVar36 + 0x120) + *(float *)(uVar36 + 0x180);
          auVar96._4_4_ =
               *(float *)(uVar36 + 100) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xc4) +
               fVar6 * *(float *)(uVar36 + 0x124) + *(float *)(uVar36 + 0x184);
          auVar96._8_4_ =
               *(float *)(uVar36 + 0x68) * fVar97 +
               fVar5 * *(float *)(uVar36 + 200) +
               fVar6 * *(float *)(uVar36 + 0x128) + *(float *)(uVar36 + 0x188);
          auVar96._12_4_ =
               *(float *)(uVar36 + 0x6c) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xcc) +
               fVar6 * *(float *)(uVar36 + 300) + *(float *)(uVar36 + 0x18c);
          auVar96._16_4_ =
               *(float *)(uVar36 + 0x70) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xd0) +
               fVar6 * *(float *)(uVar36 + 0x130) + *(float *)(uVar36 + 400);
          auVar96._20_4_ =
               *(float *)(uVar36 + 0x74) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xd4) +
               fVar6 * *(float *)(uVar36 + 0x134) + *(float *)(uVar36 + 0x194);
          auVar96._24_4_ =
               *(float *)(uVar36 + 0x78) * fVar97 +
               fVar5 * *(float *)(uVar36 + 0xd8) +
               fVar6 * *(float *)(uVar36 + 0x138) + *(float *)(uVar36 + 0x198);
          auVar96._28_4_ = fVar50 + fVar26 + *(float *)(uVar36 + 0x13c) + *(float *)(uVar36 + 0x19c)
          ;
          auVar100._0_4_ =
               *(float *)(uVar36 + 0x80) * fVar97 +
               *(float *)(uVar36 + 0xe0) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x140) + *(float *)(uVar36 + 0x1a0);
          auVar100._4_4_ =
               *(float *)(uVar36 + 0x84) * fVar97 +
               *(float *)(uVar36 + 0xe4) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x144) + *(float *)(uVar36 + 0x1a4);
          auVar100._8_4_ =
               *(float *)(uVar36 + 0x88) * fVar97 +
               *(float *)(uVar36 + 0xe8) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x148) + *(float *)(uVar36 + 0x1a8);
          auVar100._12_4_ =
               *(float *)(uVar36 + 0x8c) * fVar97 +
               *(float *)(uVar36 + 0xec) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x14c) + *(float *)(uVar36 + 0x1ac);
          auVar100._16_4_ =
               *(float *)(uVar36 + 0x90) * fVar97 +
               *(float *)(uVar36 + 0xf0) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x150) + *(float *)(uVar36 + 0x1b0);
          auVar100._20_4_ =
               *(float *)(uVar36 + 0x94) * fVar97 +
               *(float *)(uVar36 + 0xf4) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x154) + *(float *)(uVar36 + 0x1b4);
          auVar100._24_4_ =
               *(float *)(uVar36 + 0x98) * fVar97 +
               *(float *)(uVar36 + 0xf8) * fVar5 +
               fVar6 * *(float *)(uVar36 + 0x158) + *(float *)(uVar36 + 0x1b8);
          auVar100._28_4_ = fVar50 + fVar73;
          auVar27._4_4_ = fVar56 + fVar82 * *(float *)(uVar36 + 0x1c4);
          auVar27._0_4_ = fVar51 + fVar74 * *(float *)(uVar36 + 0x1c0);
          auVar27._8_4_ = fVar57 + fVar84 * *(float *)(uVar36 + 0x1c8);
          auVar27._12_4_ = fVar58 + fVar86 * *(float *)(uVar36 + 0x1cc);
          auVar27._16_4_ = fVar51 + fVar74 * *(float *)(uVar36 + 0x1d0);
          auVar27._20_4_ = fVar56 + fVar82 * *(float *)(uVar36 + 0x1d4);
          auVar27._24_4_ = fVar57 + fVar84 * *(float *)(uVar36 + 0x1d8);
          auVar27._28_4_ = fVar58 + 0.0;
          auVar49 = vsubps_avx(auVar27,auVar94);
          auVar34._4_4_ = fVar82 * *(float *)(uVar36 + 0x1e4) + fVar56;
          auVar34._0_4_ = fVar74 * *(float *)(uVar36 + 0x1e0) + fVar51;
          auVar34._8_4_ = fVar84 * *(float *)(uVar36 + 0x1e8) + fVar57;
          auVar34._12_4_ = fVar86 * *(float *)(uVar36 + 0x1ec) + fVar58;
          auVar34._16_4_ = fVar74 * *(float *)(uVar36 + 0x1f0) + fVar51;
          auVar34._20_4_ = fVar82 * *(float *)(uVar36 + 500) + fVar56;
          auVar34._24_4_ = fVar84 * *(float *)(uVar36 + 0x1f8) + fVar57;
          auVar34._28_4_ = auVar76._12_4_ + fVar58;
          auVar10 = vsubps_avx(auVar34,auVar96);
          auVar33._4_4_ = fVar82 * *(float *)(uVar36 + 0x204) + fVar56;
          auVar33._0_4_ = fVar74 * *(float *)(uVar36 + 0x200) + fVar51;
          auVar33._8_4_ = fVar84 * *(float *)(uVar36 + 0x208) + fVar57;
          auVar33._12_4_ = fVar86 * *(float *)(uVar36 + 0x20c) + fVar58;
          auVar33._16_4_ = fVar74 * *(float *)(uVar36 + 0x210) + fVar51;
          auVar33._20_4_ = fVar82 * *(float *)(uVar36 + 0x214) + fVar56;
          auVar33._24_4_ = fVar84 * *(float *)(uVar36 + 0x218) + fVar57;
          auVar33._28_4_ = fVar115 + fVar58;
          auVar11 = vsubps_avx(auVar33,auVar100);
          auVar67._0_4_ = fVar125 * auVar49._0_4_;
          auVar67._4_4_ = fVar126 * auVar49._4_4_;
          auVar67._8_4_ = fVar127 * auVar49._8_4_;
          auVar67._12_4_ = fVar128 * auVar49._12_4_;
          auVar21._16_4_ = fVar129 * auVar49._16_4_;
          auVar21._0_16_ = auVar67;
          auVar21._20_4_ = fVar130 * auVar49._20_4_;
          auVar21._24_4_ = fVar131 * auVar49._24_4_;
          auVar21._28_4_ = fVar73;
          auVar60._0_4_ = auVar10._0_4_ * fVar75;
          auVar60._4_4_ = auVar10._4_4_ * fVar83;
          auVar60._8_4_ = auVar10._8_4_ * fVar85;
          auVar60._12_4_ = auVar10._12_4_ * fVar87;
          auVar22._16_4_ = auVar10._16_4_ * fVar88;
          auVar22._0_16_ = auVar60;
          auVar22._20_4_ = auVar10._20_4_ * fVar89;
          auVar22._24_4_ = auVar10._24_4_ * fVar90;
          auVar22._28_4_ = auVar10._28_4_;
          auVar45._0_4_ = auVar11._0_4_ * fVar101;
          auVar45._4_4_ = auVar11._4_4_ * fVar107;
          auVar45._8_4_ = auVar11._8_4_ * fVar108;
          auVar45._12_4_ = auVar11._12_4_ * fVar109;
          auVar23._16_4_ = auVar11._16_4_ * fVar110;
          auVar23._0_16_ = auVar45;
          auVar23._20_4_ = auVar11._20_4_ * fVar111;
          auVar23._24_4_ = auVar11._24_4_ * fVar112;
          auVar23._28_4_ = auVar49._28_4_;
          auVar32._4_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x224);
          auVar32._0_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x220);
          auVar32._8_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 0x228);
          auVar32._12_4_ = fVar120 + fVar86 * *(float *)(uVar36 + 0x22c);
          auVar32._16_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x230);
          auVar32._20_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x234);
          auVar32._24_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 0x238);
          auVar32._28_4_ = fVar120 + fVar58;
          auVar49 = vsubps_avx(auVar32,auVar94);
          auVar31._4_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x244);
          auVar31._0_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x240);
          auVar31._8_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 0x248);
          auVar31._12_4_ = fVar120 + fVar86 * *(float *)(uVar36 + 0x24c);
          auVar31._16_4_ = fVar116 + fVar74 * *(float *)(uVar36 + 0x250);
          auVar31._20_4_ = fVar118 + fVar82 * *(float *)(uVar36 + 0x254);
          auVar31._24_4_ = fVar119 + fVar84 * *(float *)(uVar36 + 600);
          auVar31._28_4_ = fVar120 + fVar115;
          auVar10 = vsubps_avx(auVar31,auVar96);
          auVar11 = vsubps_avx(auVar117,auVar100);
          auVar93._0_4_ = fVar125 * auVar49._0_4_;
          auVar93._4_4_ = fVar126 * auVar49._4_4_;
          auVar93._8_4_ = fVar127 * auVar49._8_4_;
          auVar93._12_4_ = fVar128 * auVar49._12_4_;
          auVar24._16_4_ = fVar129 * auVar49._16_4_;
          auVar24._0_16_ = auVar93;
          auVar24._20_4_ = fVar130 * auVar49._20_4_;
          auVar24._24_4_ = fVar131 * auVar49._24_4_;
          auVar24._28_4_ = auVar49._28_4_;
          auVar79._0_4_ = auVar10._0_4_ * fVar75;
          auVar79._4_4_ = auVar10._4_4_ * fVar83;
          auVar79._8_4_ = auVar10._8_4_ * fVar85;
          auVar79._12_4_ = auVar10._12_4_ * fVar87;
          auVar25._16_4_ = auVar10._16_4_ * fVar88;
          auVar25._0_16_ = auVar79;
          auVar25._20_4_ = auVar10._20_4_ * fVar89;
          auVar25._24_4_ = auVar10._24_4_ * fVar90;
          auVar25._28_4_ = auVar63._28_4_ + auVar9._28_4_;
          auVar53._0_4_ = fVar101 * auVar11._0_4_;
          auVar53._4_4_ = fVar107 * auVar11._4_4_;
          auVar53._8_4_ = fVar108 * auVar11._8_4_;
          auVar53._12_4_ = fVar109 * auVar11._12_4_;
          auVar10._16_4_ = fVar110 * auVar11._16_4_;
          auVar10._0_16_ = auVar53;
          auVar10._20_4_ = fVar111 * auVar11._20_4_;
          auVar10._24_4_ = fVar112 * auVar11._24_4_;
          auVar10._28_4_ = fVar120 + fVar115;
          auVar44 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
          auVar102 = vpminsd_avx(auVar67,auVar93);
          auVar106._16_16_ = auVar44;
          auVar106._0_16_ = auVar102;
          auVar44 = vpminsd_avx(auVar22._16_16_,auVar25._16_16_);
          auVar102 = vpminsd_avx(auVar60,auVar79);
          auVar121._16_16_ = auVar44;
          auVar121._0_16_ = auVar102;
          auVar44 = vpminsd_avx(auVar23._16_16_,auVar10._16_16_);
          auVar102 = vpminsd_avx(auVar45,auVar53);
          auVar124._16_16_ = auVar44;
          auVar124._0_16_ = auVar102;
          auVar49 = vmaxps_avx(auVar121,auVar124);
          auVar44 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
          auVar102 = vpmaxsd_avx(auVar67,auVar93);
          auVar71._16_16_ = auVar44;
          auVar71._0_16_ = auVar102;
          auVar72 = ZEXT3264(auVar71);
          auVar44 = vpmaxsd_avx(auVar22._16_16_,auVar25._16_16_);
          auVar102 = vpmaxsd_avx(auVar60,auVar79);
          auVar62._16_16_ = auVar44;
          auVar62._0_16_ = auVar102;
          auVar44 = vpmaxsd_avx(auVar23._16_16_,auVar10._16_16_);
          auVar102 = vpmaxsd_avx(auVar45,auVar53);
          auVar48._16_16_ = auVar44;
          auVar48._0_16_ = auVar102;
          auVar10 = vminps_avx(auVar62,auVar48);
          auVar63 = vmaxps_avx(auVar122,auVar106);
          auVar49 = vmaxps_avx(auVar63,auVar49);
          auVar63 = vminps_avx(auVar123,auVar71);
          auVar10 = vminps_avx(auVar63,auVar10);
          auVar9._4_4_ = auVar49._4_4_ * 0.99999964;
          auVar9._0_4_ = auVar49._0_4_ * 0.99999964;
          auVar9._8_4_ = auVar49._8_4_ * 0.99999964;
          auVar9._12_4_ = auVar49._12_4_ * 0.99999964;
          auVar9._16_4_ = auVar49._16_4_ * 0.99999964;
          auVar9._20_4_ = auVar49._20_4_ * 0.99999964;
          auVar9._24_4_ = auVar49._24_4_ * 0.99999964;
          auVar9._28_4_ = auVar49._28_4_;
          auVar63._8_4_ = 0x3f800003;
          auVar63._0_8_ = 0x3f8000033f800003;
          auVar63._12_4_ = 0x3f800003;
          auVar63._16_4_ = 0x3f800003;
          auVar63._20_4_ = 0x3f800003;
          auVar63._24_4_ = 0x3f800003;
          auVar63._28_4_ = 0x3f800003;
          auVar49._4_4_ = auVar10._4_4_ * 1.0000004;
          auVar49._0_4_ = auVar10._0_4_ * 1.0000004;
          auVar49._8_4_ = auVar10._8_4_ * 1.0000004;
          auVar49._12_4_ = auVar10._12_4_ * 1.0000004;
          auVar49._16_4_ = auVar10._16_4_ * 1.0000004;
          auVar49._20_4_ = auVar10._20_4_ * 1.0000004;
          auVar49._24_4_ = auVar10._24_4_ * 1.0000004;
          auVar49._28_4_ = auVar10._28_4_;
          auVar49 = vcmpps_avx(auVar9,auVar49,2);
LAB_002e33a9:
          auVar44 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
        }
        else {
          auVar44 = vshufps_avx(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),0);
          auVar46._16_16_ = auVar44;
          auVar46._0_16_ = auVar44;
          pfVar2 = (float *)(uVar36 + 0x100 + uVar43);
          fVar125 = auVar44._0_4_;
          fVar101 = auVar44._4_4_;
          fVar126 = auVar44._8_4_;
          fVar83 = auVar44._12_4_;
          pfVar1 = (float *)(uVar36 + 0x40 + uVar43);
          auVar54._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar54._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar54._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar54._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar54._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar54._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar54._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar54._28_4_ = pfVar1[7] + 0.0;
          auVar30._4_4_ = fVar97;
          auVar30._0_4_ = fVar97;
          auVar30._8_4_ = fVar97;
          auVar30._12_4_ = fVar97;
          auVar30._16_4_ = fVar97;
          auVar30._20_4_ = fVar97;
          auVar30._24_4_ = fVar97;
          auVar30._28_4_ = fVar97;
          auVar49 = vsubps_avx(auVar54,auVar30);
          auVar13._4_4_ = auVar65._4_4_ * auVar49._4_4_;
          auVar13._0_4_ = auVar65._0_4_ * auVar49._0_4_;
          auVar13._8_4_ = auVar65._8_4_ * auVar49._8_4_;
          auVar13._12_4_ = auVar65._12_4_ * auVar49._12_4_;
          auVar13._16_4_ = auVar65._0_4_ * auVar49._16_4_;
          auVar13._20_4_ = auVar65._4_4_ * auVar49._20_4_;
          auVar13._24_4_ = auVar65._8_4_ * auVar49._24_4_;
          auVar13._28_4_ = auVar49._28_4_;
          pfVar2 = (float *)(uVar36 + 0x100 + uVar42);
          pfVar1 = (float *)(uVar36 + 0x40 + uVar42);
          auVar61._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar61._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar61._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar61._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar61._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar61._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar61._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar61._28_4_ = auVar64._28_4_ + pfVar1[7];
          auVar29._4_4_ = fVar5;
          auVar29._0_4_ = fVar5;
          auVar29._8_4_ = fVar5;
          auVar29._12_4_ = fVar5;
          auVar29._16_4_ = fVar5;
          auVar29._20_4_ = fVar5;
          auVar29._24_4_ = fVar5;
          auVar29._28_4_ = fVar5;
          auVar49 = vsubps_avx(auVar61,auVar29);
          auVar14._4_4_ = auVar76._4_4_ * auVar49._4_4_;
          auVar14._0_4_ = auVar76._0_4_ * auVar49._0_4_;
          auVar14._8_4_ = auVar76._8_4_ * auVar49._8_4_;
          auVar14._12_4_ = auVar76._12_4_ * auVar49._12_4_;
          auVar14._16_4_ = auVar76._0_4_ * auVar49._16_4_;
          auVar14._20_4_ = auVar76._4_4_ * auVar49._20_4_;
          auVar14._24_4_ = auVar76._8_4_ * auVar49._24_4_;
          auVar14._28_4_ = auVar49._28_4_;
          pfVar2 = (float *)(uVar36 + 0x100 + uVar40);
          pfVar1 = (float *)(uVar36 + 0x40 + uVar40);
          auVar68._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar68._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar68._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar68._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar68._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar68._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar68._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar68._28_4_ = auVar72._28_4_ + pfVar1[7];
          auVar28._4_4_ = fVar6;
          auVar28._0_4_ = fVar6;
          auVar28._8_4_ = fVar6;
          auVar28._12_4_ = fVar6;
          auVar28._16_4_ = fVar6;
          auVar28._20_4_ = fVar6;
          auVar28._24_4_ = fVar6;
          auVar28._28_4_ = fVar6;
          auVar10 = vsubps_avx(auVar68,auVar28);
          auVar15._4_4_ = auVar95._4_4_ * auVar10._4_4_;
          auVar15._0_4_ = auVar95._0_4_ * auVar10._0_4_;
          auVar15._8_4_ = auVar95._8_4_ * auVar10._8_4_;
          auVar15._12_4_ = fVar115 * auVar10._12_4_;
          auVar15._16_4_ = auVar95._0_4_ * auVar10._16_4_;
          auVar15._20_4_ = auVar95._4_4_ * auVar10._20_4_;
          auVar15._24_4_ = auVar95._8_4_ * auVar10._24_4_;
          auVar15._28_4_ = auVar10._28_4_;
          auVar49 = vmaxps_avx(auVar14,auVar15);
          auVar63 = vmaxps_avx(auVar122,auVar13);
          pfVar2 = (float *)(uVar36 + 0x100 + (uVar43 ^ 0x20));
          pfVar1 = (float *)(uVar36 + 0x40 + (uVar43 ^ 0x20));
          auVar69._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar69._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar69._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar69._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar69._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar69._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar69._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar69._28_4_ = auVar10._28_4_ + pfVar1[7];
          auVar49 = vmaxps_avx(auVar63,auVar49);
          auVar63 = vsubps_avx(auVar69,auVar30);
          pfVar2 = (float *)(uVar36 + 0x100 + (uVar42 ^ 0x20));
          auVar16._4_4_ = auVar77._4_4_ * auVar63._4_4_;
          auVar16._0_4_ = auVar77._0_4_ * auVar63._0_4_;
          auVar16._8_4_ = auVar77._8_4_ * auVar63._8_4_;
          auVar16._12_4_ = auVar77._12_4_ * auVar63._12_4_;
          auVar16._16_4_ = auVar77._0_4_ * auVar63._16_4_;
          auVar16._20_4_ = auVar77._4_4_ * auVar63._20_4_;
          auVar16._24_4_ = auVar77._8_4_ * auVar63._24_4_;
          auVar16._28_4_ = auVar63._28_4_;
          pfVar1 = (float *)(uVar36 + 0x40 + (uVar42 ^ 0x20));
          auVar70._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar70._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar70._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar70._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar70._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar70._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar70._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar70._28_4_ = auVar69._28_4_ + pfVar1[7];
          auVar63 = vsubps_avx(auVar70,auVar29);
          pfVar2 = (float *)(uVar36 + 0x100 + (uVar40 ^ 0x20));
          pfVar1 = (float *)(uVar36 + 0x40 + (uVar40 ^ 0x20));
          auVar80._0_4_ = fVar125 * *pfVar2 + *pfVar1;
          auVar80._4_4_ = fVar101 * pfVar2[1] + pfVar1[1];
          auVar80._8_4_ = fVar126 * pfVar2[2] + pfVar1[2];
          auVar80._12_4_ = fVar83 * pfVar2[3] + pfVar1[3];
          auVar80._16_4_ = fVar125 * pfVar2[4] + pfVar1[4];
          auVar80._20_4_ = fVar101 * pfVar2[5] + pfVar1[5];
          auVar80._24_4_ = fVar126 * pfVar2[6] + pfVar1[6];
          auVar80._28_4_ = fVar97 + pfVar1[7];
          auVar17._4_4_ = auVar78._4_4_ * auVar63._4_4_;
          auVar17._0_4_ = auVar78._0_4_ * auVar63._0_4_;
          auVar17._8_4_ = auVar78._8_4_ * auVar63._8_4_;
          auVar17._12_4_ = auVar78._12_4_ * auVar63._12_4_;
          auVar17._16_4_ = auVar78._0_4_ * auVar63._16_4_;
          auVar17._20_4_ = auVar78._4_4_ * auVar63._20_4_;
          auVar17._24_4_ = auVar78._8_4_ * auVar63._24_4_;
          auVar17._28_4_ = auVar63._28_4_;
          auVar63 = vsubps_avx(auVar80,auVar28);
          auVar18._4_4_ = auVar52._4_4_ * auVar63._4_4_;
          auVar18._0_4_ = auVar52._0_4_ * auVar63._0_4_;
          auVar18._8_4_ = auVar52._8_4_ * auVar63._8_4_;
          auVar18._12_4_ = fVar75 * auVar63._12_4_;
          auVar18._16_4_ = auVar52._0_4_ * auVar63._16_4_;
          auVar18._20_4_ = auVar52._4_4_ * auVar63._20_4_;
          auVar18._24_4_ = auVar52._8_4_ * auVar63._24_4_;
          auVar18._28_4_ = auVar63._28_4_;
          auVar63 = vminps_avx(auVar17,auVar18);
          auVar72 = ZEXT3264(auVar63);
          auVar10 = vminps_avx(auVar123,auVar16);
          auVar63 = vminps_avx(auVar10,auVar63);
          auVar49 = vcmpps_avx(auVar49,auVar63,2);
          if (uVar38 == 6) {
            auVar63 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar46,2);
            auVar10 = vcmpps_avx(auVar46,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
            auVar10 = vandps_avx(auVar63,auVar10);
            auVar49 = vandps_avx(auVar10,auVar49);
            goto LAB_002e33a9;
          }
          auVar44 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
        }
        auVar64 = ZEXT3264(auVar63);
        auVar44 = vpsllw_avx(auVar44,0xf);
        if ((((((((auVar44 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar44 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar44 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar44 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf]
           ) goto LAB_002e2e2b;
        auVar44 = vpacksswb_avx(auVar44,auVar44);
        bVar12 = SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar44 >> 0x17,0) & 1) << 2 | (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar44 >> 0x27,0) & 1) << 4 | (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar44 >> 0x37,0) & 1) << 6 | SUB161(auVar44 >> 0x3f,0) << 7;
        lVar8 = 0;
        if (bVar12 != 0) {
          for (; (bVar12 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar37 = *(ulong *)(uVar36 + lVar8 * 8);
        uVar38 = bVar12 - 1 & (uint)bVar12;
        if (uVar38 != 0) {
          *puVar41 = uVar37;
          puVar41 = puVar41 + 1;
          lVar8 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar37 = *(ulong *)(uVar36 + lVar8 * 8);
          uVar38 = uVar38 - 1 & uVar38;
          uVar39 = (ulong)uVar38;
          if (uVar38 != 0) {
            do {
              *puVar41 = uVar37;
              puVar41 = puVar41 + 1;
              lVar8 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              uVar37 = *(ulong *)(uVar36 + lVar8 * 8);
              uVar39 = uVar39 & uVar39 - 1;
            } while (uVar39 != 0);
          }
        }
      }
      auVar64 = ZEXT1664(auVar64._0_16_);
      auVar72 = ZEXT1664(auVar72._0_16_);
      cVar35 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar37 & 0xfffffffffffffff0) * 0x40 + 8))
                         (local_1218,ray,context);
    } while (cVar35 == '\0');
    ray->tfar = -INFINITY;
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }